

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandProve(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Abc_Frame_t *p;
  Abc_Ntk_t *pNtk;
  int iVar1;
  uint uVar2;
  int iVar3;
  abctime aVar4;
  int *__ptr;
  abctime aVar5;
  abctime time;
  char *pcVar6;
  char *pcVar7;
  Prove_Params_t Params;
  Abc_Ntk_t *local_a0;
  Abc_Frame_t *local_98;
  Abc_Ntk_t *local_90;
  Prove_Params_t local_88;
  
  local_98 = pAbc;
  local_90 = Abc_FrameReadNtk(pAbc);
  Prove_ParamsSetDefault(&local_88);
  Extra_UtilGetoptReset();
  do {
    while (iVar1 = Extra_UtilGetopt(argc,argv,"NCFGLIrfbvh"), pNtk = local_90,
          iVar3 = globalUtilOptind, 0x61 < iVar1) {
      if (iVar1 < 0x72) {
        if (iVar1 == 0x62) {
          local_88.fUseBdds = local_88.fUseBdds ^ 1;
        }
        else {
          if (iVar1 != 0x66) goto switchD_0021e376_caseD_44;
          local_88.fUseFraiging = local_88.fUseFraiging ^ 1;
        }
      }
      else if (iVar1 == 0x72) {
        local_88.fUseRewriting = local_88.fUseRewriting ^ 1;
      }
      else {
        if (iVar1 != 0x76) goto switchD_0021e376_caseD_44;
        local_88.fVerbose = local_88.fVerbose ^ 1;
      }
    }
    switch(iVar1) {
    case 0x43:
      if (argc <= globalUtilOptind) {
        pcVar7 = "Command line switch \"-C\" should be followed by an integer.\n";
LAB_0021e4f4:
        Abc_Print(-1,pcVar7);
        goto switchD_0021e376_caseD_44;
      }
      local_88.nMiteringLimitStart = atoi(argv[globalUtilOptind]);
      uVar2 = local_88.nMiteringLimitStart;
      break;
    case 0x44:
    case 0x45:
    case 0x48:
    case 0x4a:
    case 0x4b:
    case 0x4d:
      goto switchD_0021e376_caseD_44;
    case 0x46:
      if (argc <= globalUtilOptind) {
        pcVar7 = "Command line switch \"-F\" should be followed by an integer.\n";
        goto LAB_0021e4f4;
      }
      local_88.nFraigingLimitStart = atoi(argv[globalUtilOptind]);
      uVar2 = local_88.nFraigingLimitStart;
      break;
    case 0x47:
      if (argc <= globalUtilOptind) {
        pcVar7 = "Command line switch \"-G\" should be followed by an integer.\n";
        goto LAB_0021e4f4;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_88.nFraigingLimitMulti = (float)(int)uVar2;
      break;
    case 0x49:
      if (argc <= globalUtilOptind) {
        pcVar7 = "Command line switch \"-I\" should be followed by an integer.\n";
        goto LAB_0021e4f4;
      }
      uVar2 = atoi(argv[globalUtilOptind]);
      local_88.nTotalInspectLimit = (ABC_INT64_T)(int)uVar2;
      break;
    case 0x4c:
      if (argc <= globalUtilOptind) {
        pcVar7 = "Command line switch \"-L\" should be followed by an integer.\n";
        goto LAB_0021e4f4;
      }
      local_88.nMiteringLimitLast = atoi(argv[globalUtilOptind]);
      uVar2 = local_88.nMiteringLimitLast;
      break;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        pcVar7 = "Command line switch \"-N\" should be followed by an integer.\n";
        goto LAB_0021e4f4;
      }
      local_88.nItersMax = atoi(argv[globalUtilOptind]);
      uVar2 = local_88.nItersMax;
      break;
    default:
      if (iVar1 == -1) {
        if (local_90 != (Abc_Ntk_t *)0x0) {
          if (local_90->nObjCounts[8] < 1) {
            if (local_90->vCos->nSize == 1) {
              aVar4 = Abc_Clock();
              if (pNtk->ntkType == ABC_NTK_STRASH) {
                local_a0 = Abc_NtkDup(pNtk);
              }
              else {
                local_a0 = Abc_NtkStrash(pNtk,0,0,0);
              }
              iVar3 = Abc_NtkMiterProve(&local_a0,&local_88);
              if (iVar3 == 0) {
                __ptr = Abc_NtkVerifySimulatePattern(pNtk,local_a0->pModel);
                if (*__ptr != 1) {
                  Abc_Print(1,
                            "ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n")
                  ;
                }
                free(__ptr);
                pcVar7 = "SATISFIABLE    ";
              }
              else {
                pcVar7 = "UNSATISFIABLE  ";
              }
              p = local_98;
              local_98->Status = iVar3;
              pcVar6 = "UNDECIDED      ";
              if (iVar3 != -1) {
                pcVar6 = pcVar7;
              }
              Abc_Print(1,pcVar6);
              aVar5 = Abc_Clock();
              Abc_PrintTime((int)aVar5 - (int)aVar4,pcVar6,time);
              Abc_FrameReplaceCurrentNetwork(p,local_a0);
              return 0;
            }
            pcVar7 = "Currently can only solve the miter with one output.\n";
          }
          else {
            pcVar7 = "Currently can only solve the miter for combinational circuits.\n";
          }
          Abc_Print(-1,pcVar7);
          return 0;
        }
        pcVar7 = "Empty network.\n";
        iVar3 = -1;
        goto LAB_0021e66e;
      }
      goto switchD_0021e376_caseD_44;
    }
    globalUtilOptind = iVar3 + 1;
  } while (-1 < (int)uVar2);
switchD_0021e376_caseD_44:
  Abc_Print(-2,"usage: prove [-NCFGLI num] [-rfbvh]\n");
  Abc_Print(-2,"\t         solves combinational miter by rewriting, FRAIGing, and SAT\n");
  Abc_Print(-2,"\t         replaces the current network by the cone modified by rewriting\n");
  Abc_Print(-2,"\t         (there is also newer CEC command \"iprove\")\n");
  Abc_Print(-2,"\t-N num : max number of iterations [default = %d]\n",
            (ulong)(uint)local_88.nItersMax);
  Abc_Print(-2,"\t-C num : max starting number of conflicts in mitering [default = %d]\n",
            (ulong)(uint)local_88.nMiteringLimitStart);
  Abc_Print(-2,"\t-F num : max starting number of conflicts in fraiging [default = %d]\n",
            (ulong)(uint)local_88.nFraigingLimitStart);
  Abc_Print(-2,"\t-G num : multiplicative coefficient for fraiging [default = %d]\n",
            (ulong)(uint)(int)local_88.nFraigingLimitMulti);
  Abc_Print(-2,"\t-L num : max last-gasp number of conflicts in mitering [default = %d]\n",
            (ulong)(uint)local_88.nMiteringLimitLast);
  Abc_Print(-2,"\t-I num : max number of clause inspections in all SAT calls [default = %d]\n",
            local_88.nTotalInspectLimit & 0xffffffff);
  pcVar6 = "yes";
  pcVar7 = "yes";
  if (local_88.fUseRewriting == 0) {
    pcVar7 = "no";
  }
  Abc_Print(-2,"\t-r     : toggle the use of rewriting [default = %s]\n",pcVar7);
  pcVar7 = "yes";
  if (local_88.fUseFraiging == 0) {
    pcVar7 = "no";
  }
  Abc_Print(-2,"\t-f     : toggle the use of FRAIGing [default = %s]\n",pcVar7);
  pcVar7 = "yes";
  if (local_88.fUseBdds == 0) {
    pcVar7 = "no";
  }
  Abc_Print(-2,"\t-b     : toggle the use of BDDs [default = %s]\n",pcVar7);
  if (local_88.fVerbose == 0) {
    pcVar6 = "no";
  }
  Abc_Print(-2,"\t-v     : prints verbose information [default = %s]\n",pcVar6);
  pcVar7 = "\t-h     : print the command usage\n";
  iVar3 = -2;
LAB_0021e66e:
  Abc_Print(iVar3,pcVar7);
  return 1;
}

Assistant:

int Abc_CommandProve( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkTemp;
    Prove_Params_t Params, * pParams = &Params;
    int c, RetValue;
    abctime clk;

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    Prove_ParamsSetDefault( pParams );
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "NCFGLIrfbvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nItersMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nItersMax < 0 )
                goto usage;
            break;
        case 'C':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-C\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nMiteringLimitStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nMiteringLimitStart < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nFraigingLimitStart = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nFraigingLimitStart < 0 )
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nFraigingLimitMulti = (float)atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nFraigingLimitMulti < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nMiteringLimitLast = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nMiteringLimitLast < 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pParams->nTotalInspectLimit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pParams->nTotalInspectLimit < 0 )
                goto usage;
            break;
        case 'r':
            pParams->fUseRewriting ^= 1;
            break;
        case 'f':
            pParams->fUseFraiging ^= 1;
            break;
        case 'b':
            pParams->fUseBdds ^= 1;
            break;
        case 'v':
            pParams->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    if ( Abc_NtkLatchNum(pNtk) > 0 )
    {
        Abc_Print( -1, "Currently can only solve the miter for combinational circuits.\n" );
        return 0;
    }
    if ( Abc_NtkCoNum(pNtk) != 1 )
    {
        Abc_Print( -1, "Currently can only solve the miter with one output.\n" );
        return 0;
    }
    clk = Abc_Clock();

    if ( Abc_NtkIsStrash(pNtk) )
        pNtkTemp = Abc_NtkDup( pNtk );
    else
        pNtkTemp = Abc_NtkStrash( pNtk, 0, 0, 0 );

    RetValue = Abc_NtkMiterProve( &pNtkTemp, pParams );

    // verify that the pattern is correct
    if ( RetValue == 0 )
    {
        int * pSimInfo = Abc_NtkVerifySimulatePattern( pNtk, pNtkTemp->pModel );
        if ( pSimInfo[0] != 1 )
            Abc_Print( 1, "ERROR in Abc_NtkMiterProve(): Generated counter-example is invalid.\n" );
        ABC_FREE( pSimInfo );
    }
    pAbc->Status = RetValue;
    if ( RetValue == -1 )
        Abc_Print( 1, "UNDECIDED      " );
    else if ( RetValue == 0 )
        Abc_Print( 1, "SATISFIABLE    " );
    else
        Abc_Print( 1, "UNSATISFIABLE  " );
    //Abc_Print( -1, "\n" );

    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: prove [-NCFGLI num] [-rfbvh]\n" );
    Abc_Print( -2, "\t         solves combinational miter by rewriting, FRAIGing, and SAT\n" );
    Abc_Print( -2, "\t         replaces the current network by the cone modified by rewriting\n" );
    Abc_Print( -2, "\t         (there is also newer CEC command \"iprove\")\n" );
    Abc_Print( -2, "\t-N num : max number of iterations [default = %d]\n", pParams->nItersMax );
    Abc_Print( -2, "\t-C num : max starting number of conflicts in mitering [default = %d]\n", pParams->nMiteringLimitStart );
    Abc_Print( -2, "\t-F num : max starting number of conflicts in fraiging [default = %d]\n", pParams->nFraigingLimitStart );
    Abc_Print( -2, "\t-G num : multiplicative coefficient for fraiging [default = %d]\n", (int)pParams->nFraigingLimitMulti );
    Abc_Print( -2, "\t-L num : max last-gasp number of conflicts in mitering [default = %d]\n", pParams->nMiteringLimitLast );
    Abc_Print( -2, "\t-I num : max number of clause inspections in all SAT calls [default = %d]\n", (int)pParams->nTotalInspectLimit );
    Abc_Print( -2, "\t-r     : toggle the use of rewriting [default = %s]\n", pParams->fUseRewriting? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle the use of FRAIGing [default = %s]\n", pParams->fUseFraiging? "yes": "no" );
    Abc_Print( -2, "\t-b     : toggle the use of BDDs [default = %s]\n", pParams->fUseBdds? "yes": "no" );
    Abc_Print( -2, "\t-v     : prints verbose information [default = %s]\n", pParams->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}